

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trampoline.cpp
# Opt level: O3

bool __thiscall ChickenHook::Trampoline::install(Trampoline *this,bool doLock)

{
  void *pvVar1;
  undefined8 *puVar2;
  pointer puVar3;
  pointer puVar4;
  double dVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  size_t sVar16;
  undefined7 in_register_00000031;
  ulong uVar17;
  int iVar18;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar19;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar20;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  vector<unsigned_char,_std::allocator<unsigned_char>_> backjump;
  undefined1 local_988 [16];
  pointer local_978;
  int local_8f8;
  int local_8e8;
  int local_e8;
  
  if ((int)CONCAT71(in_register_00000031,doLock) != 0) {
    lock(this);
    in_XMM0_Da = extraout_XMM0_Da;
    in_XMM0_Db = extraout_XMM0_Db;
  }
  log((double)CONCAT44(in_XMM0_Db,in_XMM0_Da));
  printInfo(this);
  pvVar1 = this->_original_addr;
  sVar16 = sysconf(0x1e);
  iVar14 = mprotect((void *)((long)pvVar1 - (ulong)pvVar1 % sVar16),sVar16,7);
  if (iVar14 != 0) {
    log((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    goto LAB_0010992b;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->_original_code,0x40);
  puVar2 = (undefined8 *)this->_original_addr;
  puVar3 = (this->_original_code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar6 = *puVar2;
  uVar7 = puVar2[1];
  uVar8 = puVar2[2];
  uVar9 = puVar2[3];
  uVar10 = puVar2[4];
  uVar11 = puVar2[5];
  uVar12 = puVar2[7];
  *(undefined8 *)(puVar3 + 0x30) = puVar2[6];
  *(undefined8 *)(puVar3 + 0x38) = uVar12;
  *(undefined8 *)(puVar3 + 0x20) = uVar10;
  *(undefined8 *)(puVar3 + 0x28) = uVar11;
  *(undefined8 *)(puVar3 + 0x10) = uVar8;
  *(undefined8 *)(puVar3 + 0x18) = uVar9;
  *(undefined8 *)puVar3 = uVar6;
  *(undefined8 *)(puVar3 + 8) = uVar7;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->_real_call_code,0x40);
  generateJump((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_988,
               this->_original_addr,this->_hook_addr);
  puVar3 = (this->_trampoline).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->_trampoline).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->_trampoline).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_988._0_8_;
  (this->_trampoline).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_988._8_8_;
  (this->_trampoline).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_978;
  uVar19 = 0;
  uVar20 = 0;
  local_988._0_8_ = (pointer)0x0;
  local_988._8_8_ = (pointer)0x0;
  local_978 = (pointer)0x0;
  if ((puVar3 != (pointer)0x0) &&
     (operator_delete(puVar3,(long)puVar4 - (long)puVar3), uVar19 = extraout_XMM0_Da_01,
     uVar20 = extraout_XMM0_Db_01, (pointer)local_988._0_8_ != (pointer)0x0)) {
    operator_delete((void *)local_988._0_8_,(long)local_978 - local_988._0_8_);
    uVar19 = extraout_XMM0_Da_02;
    uVar20 = extraout_XMM0_Db_02;
  }
  puVar3 = (pointer)this->_original_addr;
  if (puVar3 == (pointer)0x0) {
LAB_001098c9:
    log((double)CONCAT44(uVar20,uVar19));
    this->_real_call_addr = (void *)0x0;
    puVar3 = (this->_real_call_code).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->_real_call_code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar3) {
      (this->_real_call_code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar3;
    }
  }
  else {
    uVar17 = (long)(this->_trampoline).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->_trampoline).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    puVar4 = (this->_real_call_code).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memset(local_988 + 8,0,0x94a);
    bVar13 = false;
    iVar18 = 0;
    uVar19 = extraout_XMM0_Da_03;
    uVar20 = extraout_XMM0_Db_03;
    local_988._0_8_ = puVar3;
    do {
      if ((uVar17 <= (ulong)(long)iVar18) && (!bVar13)) break;
      iVar15 = Disasm((PDISASM)local_988);
      if (local_e8 != 0) {
        dVar5 = log((double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
        uVar19 = SUB84(dVar5,0);
        uVar20 = (undefined4)((ulong)dVar5 >> 0x20);
        goto LAB_001098c9;
      }
      dVar5 = log((double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
      uVar19 = SUB84(dVar5,0);
      uVar20 = (undefined4)((ulong)dVar5 >> 0x20);
      if (local_8f8 != 0) {
        if (local_8f8 == 0xc) {
          if (*(uchar *)local_988._0_8_ != 0xe8) {
            dVar5 = log(dVar5);
            uVar19 = SUB84(dVar5,0);
            uVar20 = (undefined4)((ulong)dVar5 >> 0x20);
            goto LAB_001098c9;
          }
          *(int *)(local_988._0_8_ + 1) = (local_8e8 - ((int)puVar4 + iVar18)) + -5;
        }
        else {
          if (((local_8f8 == 0xd) && (uVar17 < (ulong)(long)iVar18)) && (bVar13)) {
            dVar5 = log(dVar5);
            uVar19 = SUB84(dVar5,0);
            uVar20 = (undefined4)((ulong)dVar5 >> 0x20);
            iVar18 = iVar15 + iVar18;
            break;
          }
          dVar5 = log(dVar5);
          uVar19 = SUB84(dVar5,0);
          uVar20 = (undefined4)((ulong)dVar5 >> 0x20);
          bVar13 = true;
        }
      }
      local_988._0_8_ = local_988._0_8_ + (long)iVar15;
      iVar18 = iVar18 + iVar15;
      dVar5 = log((double)CONCAT44(uVar20,uVar19));
      uVar19 = SUB84(dVar5,0);
      uVar20 = (undefined4)((ulong)dVar5 >> 0x20);
    } while (local_e8 == 0);
    if (iVar18 == -1) goto LAB_001098c9;
    log((double)CONCAT44(uVar20,uVar19));
    sVar16 = (size_t)iVar18;
    memcpy((this->_real_call_code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
           ._M_impl.super__Vector_impl_data._M_start,this->_original_addr,sVar16);
    generateJump((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_988,
                 (this->_real_call_code).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + sVar16,
                 (void *)((long)this->_original_addr + sVar16));
    memcpy((this->_real_call_code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
           ._M_impl.super__Vector_impl_data._M_start + sVar16,(void *)local_988._0_8_,
           local_988._8_8_ - local_988._0_8_);
    puVar3 = (this->_real_call_code).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar16 = sysconf(0x1e);
    iVar18 = mprotect(puVar3 + -((ulong)puVar3 % sVar16),sVar16,7);
    if (iVar18 == 0) {
      this->_real_call_addr =
           (this->_real_call_code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
           ._M_impl.super__Vector_impl_data._M_start;
      log((double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
    }
    else {
      log((double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
      this->_real_call_addr = (void *)0x0;
      puVar3 = (this->_real_call_code).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->_real_call_code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar3) {
        (this->_real_call_code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar3;
      }
    }
    if ((pointer)local_988._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_988._0_8_,(long)local_978 - local_988._0_8_);
    }
  }
  puVar3 = (this->_trampoline).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  memcpy(this->_original_addr,puVar3,
         (long)(this->_trampoline).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3);
LAB_0010992b:
  if (doLock) {
    unlock(this);
  }
  return iVar14 == 0;
}

Assistant:

bool Trampoline::install(bool doLock) {
        if (doLock) lock();
        log("Install hook at <%p>", _original_addr);
        printInfo();
        if (!updatePermissions(_original_addr, PROT_NONE | PROT_READ | PROT_WRITE | PROT_EXEC)) {
            log("Unable to update permissions <%p>", _original_addr);

            if (doLock) unlock();
            return false;
        }
        // make backup of original code
        _original_code.resize(CODE_SIZE);
        memcpy(&_original_code[0], _original_addr, CODE_SIZE);


        // create real call code
        _real_call_code.resize(CODE_SIZE); // alloc enough space ;)

        // generate jump in order to determine minimum trampoline size
        _trampoline = generateJump(_original_addr, _hook_addr);


        // check function compatibility and required trampoline size (to not destroy greater instructions)
        int requiredTrampolinSize = nextInstOff(_original_addr, _trampoline.size(),
                                                (char *) &_real_call_code[0]);




        if (requiredTrampolinSize == -1) {
            /**
             * Without landing pad, we have to copy the original code, execute it and install hook again.
             */
            log("Unsupported instructions found.. cannot use landing pad. ");
            _real_call_addr = nullptr;
            _real_call_code.clear();
        } else {
            /**
             * Our hook can call the landing pad instead of the original function in order to execute the original code.
             */
            log("Required trampoline size <%d>", requiredTrampolinSize);


            // copy original code of trampoline size and add trampoline to jump back
            memcpy(&_real_call_code[0], _original_addr, requiredTrampolinSize);
            std::vector<uint8_t> backjump = generateJump(
                    (void *) &_real_call_code[requiredTrampolinSize],
                    (void *) (((char *) _original_addr + (requiredTrampolinSize))));
            memcpy(&_real_call_code[requiredTrampolinSize], &backjump[0], backjump.size());

            // make real call code executable
            if (!updatePermissions(&_real_call_code[0], PROT_READ | PROT_WRITE | PROT_EXEC)) {
                log("Unable to update permissions of landing pad <%p>", &_real_call_code[0]);

                _real_call_addr = nullptr;
                _real_call_code.clear();
            } else {
                _real_call_addr = &_real_call_code[0];
                log("Created landing pad at <%p>", _real_call_addr);
            }
        }

        // insert jump to hooking function
        memcpy(_original_addr, &_trampoline[0], _trampoline.size());


        /*if (!updatePermissions(_original_addr, PROT_READ | PROT_EXEC)) {
            if (doLock) unlock();
            return true; // this doesn't break our use-case
        }*/


        if (doLock) unlock();
        return true;
    }